

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::zero_prefixable_int(spec *s)

{
  sequence *in_RDI;
  undefined7 in_stack_ffffffffffffff08;
  char_type in_stack_ffffffffffffff0f;
  sequence *this;
  sequence *args_1;
  digit *args;
  sequence *in_stack_ffffffffffffff30;
  digit local_c0;
  sequence local_a8 [5];
  
  this = in_RDI;
  digit::digit((digit *)in_RDI,(spec *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08)
              );
  digit::digit((digit *)this,(spec *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  args_1 = local_a8;
  character::character((character *)this,in_stack_ffffffffffffff0f);
  args = &local_c0;
  digit::digit((digit *)this,(spec *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  sequence::sequence<toml::detail::character,toml::detail::syntax::digit>
            (in_stack_ffffffffffffff30,(character *)args,(digit *)args_1);
  either::either<toml::detail::syntax::digit,toml::detail::sequence>
            ((either *)in_stack_ffffffffffffff30,args,args_1);
  repeat_at_least::repeat_at_least<toml::detail::either>
            ((repeat_at_least *)in_stack_ffffffffffffff30,(size_t)args,(either *)args_1);
  sequence::sequence<toml::detail::syntax::digit,toml::detail::repeat_at_least>
            (in_stack_ffffffffffffff30,args,(repeat_at_least *)args_1);
  repeat_at_least::~repeat_at_least((repeat_at_least *)this);
  either::~either((either *)this);
  sequence::~sequence(this);
  digit::~digit((digit *)this);
  character::~character((character *)0x75204a);
  digit::~digit((digit *)this);
  digit::~digit((digit *)this);
  return in_RDI;
}

Assistant:

TOML11_INLINE sequence zero_prefixable_int(const spec& s)
{
    return sequence(
            digit(s),
            repeat_at_least(0,
                either(
                    digit(s),
                    sequence(character('_'), digit(s))
                )
            )
        );
}